

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O0

CBlockIndex * __thiscall Chainstate::FindMostWorkChain(Chainstate *this)

{
  long lVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  reference ppCVar5;
  long in_RDI;
  long in_FS_OFFSET;
  bool fMissingData;
  bool fFailedChain;
  bool fInvalidAncestor;
  CBlockIndex *pindexNew;
  CBlockIndex *pindexFailed;
  CBlockIndex *pindexTest;
  reverse_iterator it;
  undefined4 in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  CBlockIndex *in_stack_ffffffffffffff70;
  set<CBlockIndex_*,_node::CBlockIndexWorkComparator,_std::allocator<CBlockIndex_*>_>
  *in_stack_ffffffffffffff78;
  byte local_79;
  CBlockIndex *local_50;
  CBlockIndex *local_38;
  CBlockIndex *local_30;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  AssertLockHeldInternal<AnnotatedMixin<std::recursive_mutex>>
            ((char *)in_stack_ffffffffffffff78,(char *)in_stack_ffffffffffffff70,
             in_stack_ffffffffffffff6c,(AnnotatedMixin<std::recursive_mutex> *)0x7d8f8a);
  do {
    std::set<CBlockIndex_*,_node::CBlockIndexWorkComparator,_std::allocator<CBlockIndex_*>_>::rbegin
              ((set<CBlockIndex_*,_node::CBlockIndexWorkComparator,_std::allocator<CBlockIndex_*>_>
                *)in_stack_ffffffffffffff70);
    std::set<CBlockIndex_*,_node::CBlockIndexWorkComparator,_std::allocator<CBlockIndex_*>_>::rend
              ((set<CBlockIndex_*,_node::CBlockIndexWorkComparator,_std::allocator<CBlockIndex_*>_>
                *)in_stack_ffffffffffffff70);
    bVar2 = std::operator==<std::_Rb_tree_const_iterator<CBlockIndex_*>_>
                      ((reverse_iterator<std::_Rb_tree_const_iterator<CBlockIndex_*>_> *)
                       in_stack_ffffffffffffff78,
                       (reverse_iterator<std::_Rb_tree_const_iterator<CBlockIndex_*>_> *)
                       in_stack_ffffffffffffff70);
    if (bVar2) {
      local_50 = (CBlockIndex *)0x0;
      break;
    }
    ppCVar5 = std::reverse_iterator<std::_Rb_tree_const_iterator<CBlockIndex_*>_>::operator*
                        ((reverse_iterator<std::_Rb_tree_const_iterator<CBlockIndex_*>_> *)
                         in_stack_ffffffffffffff70);
    local_50 = *ppCVar5;
    bVar2 = false;
    local_30 = local_50;
    while( true ) {
      local_79 = 0;
      if (local_30 != (CBlockIndex *)0x0) {
        bVar3 = CChain::Contains((CChain *)in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
        local_79 = bVar3 ^ 0xff;
      }
      if ((local_79 & 1) == 0) goto LAB_007d9217;
      bVar4 = CBlockIndex::HaveNumChainTxs
                        ((CBlockIndex *)
                         CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
      bVar3 = true;
      if (!bVar4) {
        bVar3 = local_30->nHeight == 0;
      }
      if (!bVar3) {
        __assert_fail("pindexTest->HaveNumChainTxs() || pindexTest->nHeight == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                      ,0xcb2,"CBlockIndex *Chainstate::FindMostWorkChain()");
      }
      bVar3 = (local_30->nStatus & 0x60) != 0;
      bVar4 = (local_30->nStatus & 8) == 0;
      if ((bVar3) || (bVar4)) break;
      local_30 = local_30->pprev;
    }
    local_38 = local_50;
    if ((bVar3) &&
       ((*(long *)(*(long *)(in_RDI + 0x50) + 0x18) == 0 ||
        (bVar2 = operator>((base_uint<256U> *)in_stack_ffffffffffffff78,
                           (base_uint<256U> *)in_stack_ffffffffffffff70), bVar2)))) {
      *(CBlockIndex **)(*(long *)(in_RDI + 0x50) + 0x18) = local_50;
    }
    for (; local_30 != local_38; local_38 = local_38->pprev) {
      if (bVar3) {
        local_38->nStatus = local_38->nStatus | 0x40;
        std::set<CBlockIndex_*,_std::less<CBlockIndex_*>,_std::allocator<CBlockIndex_*>_>::insert
                  ((set<CBlockIndex_*,_std::less<CBlockIndex_*>,_std::allocator<CBlockIndex_*>_> *)
                   in_stack_ffffffffffffff78,(value_type *)in_stack_ffffffffffffff70);
      }
      else if (bVar4) {
        in_stack_ffffffffffffff78 =
             (set<CBlockIndex_*,_node::CBlockIndexWorkComparator,_std::allocator<CBlockIndex_*>_> *)
             (*(long *)(in_RDI + 0x48) + 0x220);
        std::make_pair<CBlockIndex*&,CBlockIndex*&>
                  ((CBlockIndex **)in_stack_ffffffffffffff78,
                   (CBlockIndex **)in_stack_ffffffffffffff70);
        std::
        multimap<CBlockIndex*,CBlockIndex*,std::less<CBlockIndex*>,std::allocator<std::pair<CBlockIndex*const,CBlockIndex*>>>
        ::insert<std::pair<CBlockIndex*,CBlockIndex*>>
                  ((multimap<CBlockIndex_*,_CBlockIndex_*,_std::less<CBlockIndex_*>,_std::allocator<std::pair<CBlockIndex_*const,_CBlockIndex_*>_>_>
                    *)in_stack_ffffffffffffff70,
                   (pair<CBlockIndex_*,_CBlockIndex_*> *)
                   CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
      }
      std::set<CBlockIndex_*,_node::CBlockIndexWorkComparator,_std::allocator<CBlockIndex_*>_>::
      erase(in_stack_ffffffffffffff78,(key_type *)in_stack_ffffffffffffff70);
    }
    std::set<CBlockIndex_*,_node::CBlockIndexWorkComparator,_std::allocator<CBlockIndex_*>_>::erase
              (in_stack_ffffffffffffff78,(key_type *)in_stack_ffffffffffffff70);
    bVar2 = true;
LAB_007d9217:
  } while (bVar2);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_50;
  }
  __stack_chk_fail();
}

Assistant:

CBlockIndex* Chainstate::FindMostWorkChain()
{
    AssertLockHeld(::cs_main);
    do {
        CBlockIndex *pindexNew = nullptr;

        // Find the best candidate header.
        {
            std::set<CBlockIndex*, CBlockIndexWorkComparator>::reverse_iterator it = setBlockIndexCandidates.rbegin();
            if (it == setBlockIndexCandidates.rend())
                return nullptr;
            pindexNew = *it;
        }

        // Check whether all blocks on the path between the currently active chain and the candidate are valid.
        // Just going until the active chain is an optimization, as we know all blocks in it are valid already.
        CBlockIndex *pindexTest = pindexNew;
        bool fInvalidAncestor = false;
        while (pindexTest && !m_chain.Contains(pindexTest)) {
            assert(pindexTest->HaveNumChainTxs() || pindexTest->nHeight == 0);

            // Pruned nodes may have entries in setBlockIndexCandidates for
            // which block files have been deleted.  Remove those as candidates
            // for the most work chain if we come across them; we can't switch
            // to a chain unless we have all the non-active-chain parent blocks.
            bool fFailedChain = pindexTest->nStatus & BLOCK_FAILED_MASK;
            bool fMissingData = !(pindexTest->nStatus & BLOCK_HAVE_DATA);
            if (fFailedChain || fMissingData) {
                // Candidate chain is not usable (either invalid or missing data)
                if (fFailedChain && (m_chainman.m_best_invalid == nullptr || pindexNew->nChainWork > m_chainman.m_best_invalid->nChainWork)) {
                    m_chainman.m_best_invalid = pindexNew;
                }
                CBlockIndex *pindexFailed = pindexNew;
                // Remove the entire chain from the set.
                while (pindexTest != pindexFailed) {
                    if (fFailedChain) {
                        pindexFailed->nStatus |= BLOCK_FAILED_CHILD;
                        m_blockman.m_dirty_blockindex.insert(pindexFailed);
                    } else if (fMissingData) {
                        // If we're missing data, then add back to m_blocks_unlinked,
                        // so that if the block arrives in the future we can try adding
                        // to setBlockIndexCandidates again.
                        m_blockman.m_blocks_unlinked.insert(
                            std::make_pair(pindexFailed->pprev, pindexFailed));
                    }
                    setBlockIndexCandidates.erase(pindexFailed);
                    pindexFailed = pindexFailed->pprev;
                }
                setBlockIndexCandidates.erase(pindexTest);
                fInvalidAncestor = true;
                break;
            }
            pindexTest = pindexTest->pprev;
        }
        if (!fInvalidAncestor)
            return pindexNew;
    } while(true);
}